

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

int omac_acpkm_key(OMAC_ACPKM_CTX *c,EVP_CIPHER *cipher,uchar *key,size_t key_size)

{
  CMAC_ACPKM_CTX *pCVar1;
  long *in_RDI;
  EVP_CIPHER *unaff_retaddr;
  size_t in_stack_00000008;
  int ret;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = 0;
  pCVar1 = CMAC_ACPKM_CTX_new();
  *in_RDI = (long)pCVar1;
  if (*in_RDI == 0) {
    ERR_GOST_error(iVar2,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    iVar2 = 0;
  }
  else {
    iVar2 = CMAC_ACPKM_Init((CMAC_ACPKM_CTX *)key,(void *)key_size,in_stack_00000008,unaff_retaddr,
                            (ENGINE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
    if (0 < iVar2) {
      *(undefined4 *)(in_RDI + 3) = 1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int omac_acpkm_key(OMAC_ACPKM_CTX *c, const EVP_CIPHER *cipher,
                          const unsigned char *key, size_t key_size)
{
    int ret = 0;

    c->cmac_ctx = CMAC_ACPKM_CTX_new();
    if (c->cmac_ctx == NULL) {
        GOSTerr(GOST_F_OMAC_ACPKM_KEY, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    ret = CMAC_ACPKM_Init(c->cmac_ctx, key, key_size, cipher, NULL);
    if (ret > 0) {
        c->key_set = 1;
    }
    return 1;
}